

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

gs_stmt_t * gs_parse_stmt_decl(gs_parser_t *parser)

{
  vec_gs_token_t tokens_00;
  vec_gs_val_type_t arg_types_00;
  vec_gs_token_t arg_symbols_00;
  char *pcVar1;
  _Bool _Var2;
  int iVar3;
  gs_expr_type *pgVar4;
  char *pcVar5;
  gs_token_t local_118;
  undefined1 local_100 [8];
  gs_token_t token;
  gs_stmt_t *body;
  gs_token_t local_c8;
  undefined1 local_b0 [8];
  gs_token_t arg_symbol;
  gs_val_type arg_type;
  char *fn_name;
  gs_token_t symbol;
  gs_stmt_t *pgStack_68;
  gs_val_type type;
  gs_stmt_t *stmt;
  gs_expr_t *init;
  vec_gs_token_t arg_symbols;
  vec_gs_val_type_t arg_types;
  vec_gs_token_t tokens;
  gs_parser_t *parser_local;
  
  tokens.alloc_category = (char *)parser;
  memset(&arg_types.alloc_category,0,0x18);
  tokens._8_8_ = anon_var_dwarf_24b08;
  memset(&arg_symbols.alloc_category,0,0x18);
  arg_types._8_8_ = anon_var_dwarf_24b08;
  memset(&init,0,0x18);
  arg_symbols._8_8_ = anon_var_dwarf_24b08;
  stmt = (gs_stmt_t *)0x0;
  pgStack_68 = (gs_stmt_t *)0x0;
  symbol.field_3.symbol._4_4_ = gs_parse_type(tokens.alloc_category);
  if ((tokens.alloc_category[0x1c] & 1U) == 0) {
    gs_peek((gs_token_t *)&fn_name,(gs_parser_t *)tokens.alloc_category);
    if ((int)fn_name == 2) {
      gs_eat((gs_parser_t *)tokens.alloc_category);
      iVar3 = vec_expand_(&arg_types.alloc_category,(int *)&tokens,(int *)((long)&tokens.data + 4),
                          0x18,(char *)tokens._8_8_);
      if (iVar3 == 0) {
        pcVar5 = arg_types.alloc_category + (long)(int)tokens.data * 0x18;
        *(ulong *)pcVar5 = CONCAT44(fn_name._4_4_,(int)fn_name);
        *(undefined8 *)(pcVar5 + 8) = symbol._0_8_;
        *(undefined8 *)(pcVar5 + 0x10) = symbol._8_8_;
        tokens.data._0_4_ = (int)tokens.data + 1;
      }
      _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,'(');
      if (_Var2) {
        pcVar5 = *(char **)(arg_types.alloc_category + 0x10);
        _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,')');
        if (!_Var2) {
          do {
            arg_symbol.field_3.symbol._4_4_ = gs_parse_type(tokens.alloc_category);
            if ((tokens.alloc_category[0x1c] & 1U) != 0) goto LAB_00158b53;
            gs_peek((gs_token_t *)local_b0,(gs_parser_t *)tokens.alloc_category);
            if (local_b0._0_4_ != GS_TOKEN_SYMBOL) {
              gs_parser_error((gs_parser_t *)tokens.alloc_category,0x2a23d4,pcVar5);
              goto LAB_00158b53;
            }
            gs_eat((gs_parser_t *)tokens.alloc_category);
            iVar3 = vec_expand_(&arg_symbols.alloc_category,(int *)&arg_types,
                                (int *)((long)&arg_types.data + 4),4,(char *)arg_types._8_8_);
            if (iVar3 == 0) {
              *(undefined4 *)(arg_symbols.alloc_category + (long)(int)arg_types.data * 4) =
                   arg_symbol.field_3._4_4_;
              arg_types.data._0_4_ = (int)arg_types.data + 1;
            }
            iVar3 = vec_expand_((char **)&init,(int *)&arg_symbols,
                                (int *)((long)&arg_symbols.data + 4),0x18,(char *)arg_symbols._8_8_)
            ;
            if (iVar3 == 0) {
              pgVar4 = &init->type + (long)(int)arg_symbols.data * 6;
              *(ulong *)pgVar4 = CONCAT44(local_b0._4_4_,local_b0._0_4_);
              ((gs_token_t *)(pgVar4 + 2))->type = arg_symbol.type;
              ((gs_token_t *)(pgVar4 + 2))->line = arg_symbol.line;
              *(undefined8 *)(pgVar4 + 4) = arg_symbol._8_8_;
              arg_symbols.data._0_4_ = (int)arg_symbols.data + 1;
            }
            _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,',');
          } while (_Var2);
          _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,')');
          pcVar1 = tokens.alloc_category;
          if (!_Var2) {
            gs_peek(&local_c8,(gs_parser_t *)tokens.alloc_category);
            gs_parser_error((gs_parser_t *)pcVar1,0x2a23fd,pcVar5);
            goto LAB_00158b53;
          }
        }
        _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,'{');
        pcVar1 = tokens.alloc_category;
        if (_Var2) {
          token.field_3.symbol = (char *)gs_parse_stmt_block(tokens.alloc_category);
          if ((tokens.alloc_category[0x1c] & 1U) == 0) {
            arg_types_00.capacity = arg_types.data._4_4_;
            arg_types_00.length = (int)arg_types.data;
            arg_symbols_00.capacity = arg_symbols.data._4_4_;
            arg_symbols_00.length = (int)arg_symbols.data;
            arg_types_00.data = (gs_val_type *)arg_symbols.alloc_category;
            arg_types_00.alloc_category = (char *)arg_types._8_8_;
            arg_symbols_00.data = (gs_token_t *)init;
            arg_symbols_00.alloc_category = (char *)arg_symbols._8_8_;
            pgStack_68 = gs_stmt_fn_decl_new((gs_parser_t *)tokens.alloc_category,
                                             symbol.field_3._4_4_,
                                             *(gs_token_t *)arg_types.alloc_category,arg_types_00,
                                             arg_symbols_00,(gs_stmt_t *)token.field_3.symbol);
          }
        }
        else {
          gs_peek((gs_token_t *)&body,(gs_parser_t *)tokens.alloc_category);
          gs_parser_error((gs_parser_t *)pcVar1,0x2a2423,pcVar5);
        }
      }
      else {
        while (_Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,','), _Var2) {
          gs_peek((gs_token_t *)local_100,(gs_parser_t *)tokens.alloc_category);
          if (local_100._0_4_ != GS_TOKEN_SYMBOL) {
            gs_parser_error((gs_parser_t *)tokens.alloc_category,0x2a2449);
            goto LAB_00158b53;
          }
          gs_eat((gs_parser_t *)tokens.alloc_category);
          iVar3 = vec_expand_(&arg_types.alloc_category,(int *)&tokens,
                              (int *)((long)&tokens.data + 4),0x18,(char *)tokens._8_8_);
          if (iVar3 == 0) {
            pcVar5 = arg_types.alloc_category + (long)(int)tokens.data * 0x18;
            *(ulong *)pcVar5 = CONCAT44(local_100._4_4_,local_100._0_4_);
            *(undefined8 *)(pcVar5 + 8) = token._0_8_;
            *(undefined8 *)(pcVar5 + 0x10) = token._8_8_;
            tokens.data._0_4_ = (int)tokens.data + 1;
          }
        }
        _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,'=');
        if ((!_Var2) ||
           (stmt = (gs_stmt_t *)gs_parse_expr((gs_parser_t *)tokens.alloc_category),
           (tokens.alloc_category[0x1c] & 1U) == 0)) {
          _Var2 = gs_eat_char((gs_parser_t *)tokens.alloc_category,';');
          pcVar5 = tokens.alloc_category;
          if (_Var2) {
            tokens_00.capacity = tokens.data._4_4_;
            tokens_00.length = (int)tokens.data;
            tokens_00.data = (gs_token_t *)arg_types.alloc_category;
            tokens_00.alloc_category = (char *)tokens._8_8_;
            pgStack_68 = gs_stmt_var_decl_new
                                   ((gs_parser_t *)tokens.alloc_category,symbol.field_3._4_4_,
                                    tokens_00,(gs_expr_t *)stmt);
          }
          else {
            gs_peek(&local_118,(gs_parser_t *)tokens.alloc_category);
            gs_parser_error((gs_parser_t *)pcVar5,0x2a247b);
          }
        }
      }
    }
    else {
      gs_parser_error((gs_parser_t *)tokens.alloc_category,0x2a23ab);
    }
  }
LAB_00158b53:
  golf_free_tracked(arg_types.alloc_category);
  golf_free_tracked(init);
  golf_free_tracked(arg_symbols.alloc_category);
  return pgStack_68;
}

Assistant:

static gs_stmt_t *gs_parse_stmt_decl(gs_parser_t *parser) {
    vec_gs_token_t tokens;
    vec_init(&tokens, "script/parser");

    vec_gs_val_type_t arg_types;
    vec_init(&arg_types, "script/parser");

    vec_gs_token_t arg_symbols;
    vec_init(&arg_symbols, "script/parser");

    gs_expr_t *init = NULL;
    gs_stmt_t *stmt = NULL;

    gs_val_type type = gs_parse_type(parser);
    if (parser->error) goto cleanup;

    {
        gs_token_t symbol = gs_peek(parser);
        if (symbol.type != GS_TOKEN_SYMBOL) {
            gs_parser_error(parser, symbol, "Expected symbol when parsing declaration");
            goto cleanup;
        }
        gs_eat(parser);
        vec_push(&tokens, symbol);
    }

    if (gs_eat_char(parser, '(')) {
        const char *fn_name = tokens.data[0].symbol;

        if (!gs_eat_char(parser, ')')) {
            while (true) {
                gs_val_type arg_type = gs_parse_type(parser);
                if (parser->error) goto cleanup;

                gs_token_t arg_symbol = gs_peek(parser);
                if (arg_symbol.type != GS_TOKEN_SYMBOL) {
                    gs_parser_error(parser, arg_symbol, "Expected symbol when parsing function %s", fn_name);
                    goto cleanup;
                }
                gs_eat(parser);

                vec_push(&arg_types, arg_type);
                vec_push(&arg_symbols, arg_symbol);

                if (!gs_eat_char(parser, ',')) {
                    if (!gs_eat_char(parser, ')')) {
                        gs_parser_error(parser, gs_peek(parser), "Expected ')' when parsing function %s", fn_name);
                        goto cleanup;
                    }
                    break;
                }
            }
        }

        if (!gs_eat_char(parser, '{')) {
            gs_parser_error(parser, gs_peek(parser), "Expected '{' when parsing function %s", fn_name);
            goto cleanup;
        }

        gs_stmt_t *body = gs_parse_stmt_block(parser);
        if (parser->error) goto cleanup;

        stmt = gs_stmt_fn_decl_new(parser, type, tokens.data[0], arg_types, arg_symbols, body);
    }
    else {
        while (gs_eat_char(parser, ',')) {
            gs_token_t token = gs_peek(parser);
            if (token.type != GS_TOKEN_SYMBOL) {
                gs_parser_error(parser, token, "Expected symbol when parsing variable declaration");
                goto cleanup;
            }
            gs_eat(parser);
            vec_push(&tokens, token);
        }

        if (gs_eat_char(parser, '=')) {
            init = gs_parse_expr(parser);
            if (parser->error) goto cleanup;
        }

        if (!gs_eat_char(parser, ';')) {
            gs_parser_error(parser, gs_peek(parser), "Expected ';' when parsing variable declaration");
            goto cleanup;
        }

        stmt = gs_stmt_var_decl_new(parser, type, tokens, init);
    }

cleanup:
    vec_deinit(&tokens);
    vec_deinit(&arg_symbols);
    vec_deinit(&arg_types);
    return stmt;
}